

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O1

bool __thiscall wabt::WastLexer::ReadBlockComment(WastLexer *this,WastParser *parser)

{
  byte *pbVar1;
  int iVar2;
  byte *pbVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  
  pbVar1 = (byte *)this->buffer_end_;
  pbVar3 = (byte *)this->cursor_;
  iVar2 = this->line_;
  iVar4 = 1;
  do {
    do {
      while( true ) {
        uVar5 = 0xffffffff;
        if (pbVar3 < pbVar1) {
          this->cursor_ = (char *)(pbVar3 + 1);
          uVar5 = (uint)*pbVar3;
          pbVar3 = pbVar3 + 1;
        }
        if (0x3a < (int)uVar5) break;
        if (uVar5 == 0xffffffff) {
          WastParser::Error(parser,0x19896a);
          return false;
        }
        if (uVar5 == 10) {
          iVar2 = iVar2 + 1;
          this->line_ = iVar2;
          this->line_start_ = (char *)pbVar3;
        }
        else if (uVar5 == 0x28) {
          if (pbVar3 < pbVar1) {
            bVar6 = *pbVar3 == 0x3b;
          }
          else {
            bVar6 = false;
          }
          if (bVar6 == true && pbVar3 < pbVar1) {
            pbVar3 = pbVar3 + 1;
            this->cursor_ = (char *)pbVar3;
          }
          iVar4 = iVar4 + (uint)bVar6;
        }
      }
    } while (uVar5 != 0x3b);
    if (pbVar3 < pbVar1) {
      bVar6 = *pbVar3 == 0x29;
    }
    else {
      bVar6 = false;
    }
    if (bVar6 && pbVar3 < pbVar1) {
      pbVar3 = pbVar3 + 1;
      this->cursor_ = (char *)pbVar3;
    }
  } while ((!bVar6) || (iVar4 = iVar4 + -1, iVar4 != 0));
  return true;
}

Assistant:

bool WastLexer::ReadBlockComment(WastParser* parser) {
  int nesting = 1;
  while (true) {
    switch (ReadChar()) {
      case kEof:
        ERROR("EOF in block comment");
        return false;

      case ';':
        if (MatchChar(')') && --nesting == 0) {
          return true;
        }
        break;

      case '(':
        if (MatchChar(';')) {
          nesting++;
        }
        break;

      case '\n':
        Newline();
        break;
    }
  }
}